

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

void __thiscall vox::DICTitem::DICTitem(DICTitem *this,string *vKey,string *vValue)

{
  string *vValue_local;
  string *vKey_local;
  DICTitem *this_local;
  
  DICTstring::DICTstring(&this->key);
  DICTstring::DICTstring(&this->value);
  std::__cxx11::string::operator=((string *)&(this->key).buffer,(string *)vKey);
  std::__cxx11::string::operator=((string *)&(this->value).buffer,(string *)vValue);
  return;
}

Assistant:

DICTitem::DICTitem(std::string vKey, std::string vValue) {
    key.buffer   = vKey;
    value.buffer = vValue;
}